

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Throw * __thiscall
wasm::Builder::makeThrow<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,Name tag,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args)

{
  Throw *pTVar1;
  MixedArena *this_00;
  
  this_00 = &this->wasm->allocator;
  pTVar1 = (Throw *)MixedArena::allocSpace(this_00,0x40,8);
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)54>).super_Expression._id = ThrowId;
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)54>).super_Expression.type.id = 0;
  (pTVar1->tag).super_IString.str._M_len = 0;
  (pTVar1->tag).super_IString.str._M_str = (char *)0x0;
  (pTVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
       = (Expression **)0x0;
  (pTVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pTVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pTVar1->operands).allocator = this_00;
  (pTVar1->tag).super_IString.str._M_len = tag.super_IString.str._M_len;
  (pTVar1->tag).super_IString.str._M_str = tag.super_IString.str._M_str;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pTVar1->operands,
             args);
  ::wasm::Throw::finalize();
  return pTVar1;
}

Assistant:

Throw* makeThrow(Name tag, const T& args) {
    auto* ret = wasm.allocator.alloc<Throw>();
    ret->tag = tag;
    ret->operands.set(args);
    ret->finalize();
    return ret;
  }